

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::egl::ChooseConfigRandomCase::iterate(ChooseConfigRandomCase *this)

{
  ostringstream *this_00;
  int iVar1;
  int iVar2;
  MessageBuilder *this_01;
  deUint32 seed;
  Random rnd;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> attributes;
  deRandom dStack_1a8;
  undefined1 local_198 [384];
  
  local_198._0_8_ =
       ((this->super_ChooseConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Iteration :");
  this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_198,&this->m_iterNdx);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  seed = this->m_iterNdx + 1;
  this->m_iterNdx = seed;
  deRandom_init(&dStack_1a8,seed);
  iVar2 = de::Random::getInt((Random *)&dStack_1a8,0,
                             (int)(this->m_attribSet)._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count * 2);
  genRandomAttributes((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                       *)local_198,this,&this->m_attribSet,iVar2,(Random *)&dStack_1a8);
  ChooseConfigCase::fillDontCare
            (&this->super_ChooseConfigCase,
             (vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )local_198);
  ChooseConfigCase::executeTest
            (&this->super_ChooseConfigCase,
             (vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )local_198,(this->super_ChooseConfigCase).m_checkOrder);
  iVar1 = this->m_iterNdx;
  iVar2 = this->m_numIters;
  std::_Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
  ~_Vector_base((_Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                 *)local_198);
  return (IterateResult)(iVar1 < iVar2);
}

Assistant:

TestCase::IterateResult iterate (void)
	{
		m_testCtx.getLog() << TestLog::Message << "Iteration :" << m_iterNdx << TestLog::EndMessage;
		m_iterNdx += 1;

		// Build random list of attributes
		de::Random									rnd(m_iterNdx);
		const int									numAttribs	= rnd.getInt(0, (int)m_attribSet.size()*2);

		std::vector<std::pair<EGLenum, EGLint> >	attributes	= genRandomAttributes(m_attribSet, numAttribs, rnd);

		fillDontCare(attributes);
		executeTest(attributes, m_checkOrder);

		return m_iterNdx < m_numIters ? CONTINUE : STOP;
	}